

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::SubroutinesTessEval::Run(SubroutinesTessEval *this)

{
  CallLogWrapper *this_00;
  long *src_gs;
  long *src_tes;
  long *src_tcs;
  long *src_vs;
  GLuint program;
  long error;
  undefined1 in_stack_ffffffffffffff28;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x16])(local_50,this);
  src_vs = local_50[0];
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x18])(local_70,this);
  src_tcs = local_70[0];
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x19])(local_90,this);
  src_tes = local_90[0];
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1a])(local_b0,this);
  src_gs = local_b0[0];
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x17])(local_d0,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,(char *)src_vs,(char *)src_tcs,(char *)src_tes,(char *)src_gs
                       ,(char *)local_d0[0],(bool)in_stack_ffffffffffffff28);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this_00 = &(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_50[0] = (long *)0x0;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1d])(this,(ulong)program,local_50);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return (long)local_50[0];
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), TessControlShader().c_str(), TessEvalShader().c_str(),
									   GeometryShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);
		long error = NO_ERROR;

		VerifyTES(program, error);

		glDeleteProgram(program);
		return error;
	}